

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O0

bool read_gt_data(string *filename,vector<ground_truth,_std::allocator<ground_truth>_> *gt)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  istream *piVar4;
  undefined1 local_408 [8];
  ground_truth single_gt;
  double azimuth;
  double y;
  double x;
  istringstream iss_pos;
  string local_258 [8];
  string line_pos;
  long local_228;
  ifstream in_file_pos;
  vector<ground_truth,_std::allocator<ground_truth>_> *gt_local;
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&x,local_258,_S_in);
      std::istream::operator>>((istream *)&x,&y);
      std::istream::operator>>((istream *)&x,&azimuth);
      std::istream::operator>>((istream *)&x,&single_gt.theta);
      local_408 = (undefined1  [8])y;
      single_gt.x = azimuth;
      single_gt.y = single_gt.theta;
      std::vector<ground_truth,_std::allocator<ground_truth>_>::push_back
                (gt,(value_type *)local_408);
      std::__cxx11::istringstream::~istringstream((istringstream *)&x);
    }
    filename_local._7_1_ = true;
    std::__cxx11::string::~string(local_258);
  }
  else {
    filename_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return filename_local._7_1_;
}

Assistant:

inline bool read_gt_data(const std::string& filename, std::vector<ground_truth>& gt) {

	// Get file of position measurements:
	std::ifstream in_file_pos(filename.c_str(),std::ifstream::in);
	// Return if we can't open the file.
	if (!in_file_pos) {
		return false;
	}

	// Declare single line of position measurement file:
	std::string line_pos;

	// Run over each single line:
	while(getline(in_file_pos, line_pos)){

		std::istringstream iss_pos(line_pos);

		// Declare position values:
		double x, y, azimuth;

		// Declare single ground truth:
		ground_truth single_gt; 

		//read data from line to values:
		iss_pos >> x;
		iss_pos >> y;
		iss_pos >> azimuth;

		// Set values
		single_gt.x = x;
		single_gt.y = y;
		single_gt.theta = azimuth;

		// Add to list of control measurements and ground truth:
		gt.push_back(single_gt);
	}
	return true;
}